

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.h
# Opt level: O0

bool __thiscall
tonk::SenderBandwidthControl::ShouldSendProbe(SenderBandwidthControl *this,int bytes)

{
  __int_type_conflict3 _Var1;
  int in_ESI;
  __atomic_base<int> *in_RDI;
  bool local_1d;
  
  local_1d = false;
  if (in_ESI <= (int)((uint)in_RDI[0x16]._M_i >> 1)) {
    _Var1 = std::__atomic_base::operator_cast_to_int(in_RDI);
    local_1d = in_ESI <= _Var1;
  }
  return local_1d;
}

Assistant:

bool ShouldSendProbe(int bytes)
    {
        return GetAvailableProbeBytes() >= bytes
            && GetAvailableBytes() >= bytes;
    }